

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O2

int kvtree_util_get_double(kvtree *hash,char *key,double *val)

{
  int iVar1;
  char *str;
  double val_tmp;
  
  str = kvtree_get_val(hash,key);
  if ((str != (char *)0x0) && (iVar1 = kvtree_atod(str,&val_tmp), iVar1 == 0)) {
    *val = val_tmp;
    return 0;
  }
  return 1;
}

Assistant:

int kvtree_util_get_double(const kvtree* hash, const char* key, double* val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    double val_tmp;
    if (kvtree_atod(val_str, &val_tmp) == KVTREE_SUCCESS) {
      *val = val_tmp;
      rc = KVTREE_SUCCESS;
    }
  }

  return rc;
}